

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O2

uint64_t absl::lts_20250127::hash_internal::LowLevelHash
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong *puVar10;
  ulong *puVar11;
  uint64_t uVar12;
  ulong uVar13;
  
  if (0x10 < len) {
    uVar12 = seed ^ *salt;
    uVar8 = len;
    puVar10 = (ulong *)data;
    puVar11 = (ulong *)data;
    uVar9 = uVar12;
    uVar7 = uVar12;
    uVar6 = uVar12;
    if (0x40 < len) {
      do {
        uVar13 = puVar10[2];
        uVar1 = puVar10[4];
        uVar2 = puVar10[3];
        uVar3 = puVar10[5];
        uVar4 = puVar10[6];
        uVar5 = puVar10[7];
        puVar11 = puVar10 + 8;
        uVar6 = Mix(salt[1] ^ *puVar10,uVar6 ^ puVar10[1]);
        uVar9 = Mix(uVar13 ^ salt[2],uVar9 ^ uVar2);
        uVar7 = Mix(uVar1 ^ salt[3],uVar7 ^ uVar3);
        uVar12 = Mix(uVar4 ^ salt[4],uVar12 ^ uVar5);
        uVar8 = uVar8 - 0x40;
        puVar10 = puVar11;
      } while (0x40 < uVar8);
      uVar12 = uVar12 + uVar7 ^ uVar6 ^ uVar9;
    }
    if (0x20 < uVar8) {
      uVar13 = puVar11[2];
      uVar1 = puVar11[3];
      uVar9 = Mix(salt[1] ^ *puVar11,puVar11[1] ^ uVar12);
      uVar12 = Mix(uVar13 ^ salt[2],uVar12 ^ uVar1);
      uVar12 = uVar12 ^ uVar9;
      puVar11 = puVar11 + 4;
      uVar8 = uVar8 - 0x20;
    }
    if (0x10 < uVar8) {
      uVar12 = Mix(salt[1] ^ *puVar11,uVar12 ^ puVar11[1]);
    }
    uVar9 = Mix(*(ulong *)((long)data + (len - 0x10)) ^ salt[1] ^ len,
                uVar12 ^ *(ulong *)((long)data + (len - 8)));
    return uVar9;
  }
  if (len == 0) {
    return seed ^ *salt;
  }
  if (len < 9) {
    if (len < 4) {
      uVar8 = (ulong)CONCAT11(*data,*(undefined1 *)((long)data + (len - 1)));
      uVar13 = (ulong)*(byte *)((long)data + (len >> 1));
    }
    else {
      uVar8 = (ulong)*data;
      uVar13 = (ulong)*(uint *)((long)data + (len - 4));
    }
  }
  else {
    uVar8 = *data;
    uVar13 = *(ulong *)((long)data + (len - 8));
  }
  uVar9 = Mix(uVar8 ^ salt[1] ^ len,uVar13 ^ seed ^ *salt);
  return uVar9;
}

Assistant:

uint64_t LowLevelHash(const void* data, size_t len, uint64_t seed,
                      const uint64_t salt[5]) {
  if (len > 16) return LowLevelHashLenGt16(data, len, seed, salt);

  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  uint64_t current_state = seed ^ salt[0];
  if (len == 0) return current_state;

  uint64_t a = 0;
  uint64_t b = 0;

  // We now have a data `ptr` with at least 1 and at most 16 bytes.
  if (len > 8) {
    // When we have at least 9 and at most 16 bytes, set A to the first 64
    // bits of the input and B to the last 64 bits of the input. Yes, they
    // will overlap in the middle if we are working with less than the full 16
    // bytes.
    a = absl::base_internal::UnalignedLoad64(ptr);
    b = absl::base_internal::UnalignedLoad64(ptr + len - 8);
  } else if (len > 3) {
    // If we have at least 4 and at most 8 bytes, set A to the first 32
    // bits and B to the last 32 bits.
    a = absl::base_internal::UnalignedLoad32(ptr);
    b = absl::base_internal::UnalignedLoad32(ptr + len - 4);
  } else {
    // If we have at least 1 and at most 3 bytes, read 2 bytes into A and the
    // other byte into B, with some adjustments.
    a = static_cast<uint64_t>((ptr[0] << 8) | ptr[len - 1]);
    b = static_cast<uint64_t>(ptr[len >> 1]);
  }

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}